

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O3

bool __thiscall slang::ast::Type::isBitstreamCastable(Type *this,Type *rhs)

{
  bool bVar1;
  Type *this_00;
  Type *this_01;
  uint64_t uVar2;
  uint64_t uVar3;
  
  this_00 = this->canonical;
  if (this_00 == (Type *)0x0) {
    this->canonical = this;
    this_00 = this;
    do {
      this_00 = DeclaredType::getType((DeclaredType *)(this_00 + 1));
      this->canonical = this_00;
    } while ((this_00->super_Symbol).kind == TypeAlias);
  }
  this_01 = rhs->canonical;
  if (this_01 == (Type *)0x0) {
    rhs->canonical = rhs;
    this_01 = rhs;
    do {
      this_01 = DeclaredType::getType((DeclaredType *)(this_01 + 1));
      rhs->canonical = this_01;
    } while ((this_01->super_Symbol).kind == TypeAlias);
  }
  bVar1 = isBitstreamType(this_00,true);
  if ((bVar1) && (bVar1 = isBitstreamType(this_01,false), bVar1)) {
    bVar1 = isFixedSize(this_00);
    if ((bVar1) && (bVar1 = isFixedSize(this_01), bVar1)) {
      uVar2 = getBitstreamWidth(this_00);
      uVar3 = getBitstreamWidth(this_01);
      return uVar2 == uVar3;
    }
    bVar1 = Bitstream::dynamicSizesMatch<slang::ast::Type,slang::ast::Type>(this_00,this_01);
    return bVar1;
  }
  return false;
}

Assistant:

bool Type::isBitstreamCastable(const Type& rhs) const {
    const Type* l = &getCanonicalType();
    const Type* r = &rhs.getCanonicalType();
    if (l->isBitstreamType(true) && r->isBitstreamType()) {
        if (l->isFixedSize() && r->isFixedSize())
            return l->getBitstreamWidth() == r->getBitstreamWidth();
        else
            return Bitstream::dynamicSizesMatch(*l, *r);
    }
    return false;
}